

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

void __thiscall ExactFloat::ExactFloat(ExactFloat *this,double v)

{
  bool bVar1;
  uint uVar2;
  BIGNUM *bn;
  double dVar3;
  uint64 m;
  double f;
  int exp;
  double local_18;
  double v_local;
  ExactFloat *this_local;
  
  local_18 = v;
  v_local = (double)this;
  BigNum::BigNum(&this->bn_);
  bVar1 = std::signbit(local_18);
  this->sign_ = -(uint)bVar1 | 1;
  uVar2 = std::isnan(local_18);
  if ((uVar2 & 1) == 0) {
    uVar2 = std::isinf(local_18);
    if ((uVar2 & 1) == 0) {
      dVar3 = frexp(ABS(local_18),(int *)&f);
      dVar3 = ldexp(dVar3,0x35);
      bn = BigNum::get(&this->bn_);
      BN_ext_set_uint64(bn,(long)dVar3 | (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f
                       );
      this->bn_exp_ = f._0_4_ + -0x35;
      Canonicalize(this);
    }
    else {
      set_inf(this,this->sign_);
    }
  }
  else {
    set_nan(this);
  }
  return;
}

Assistant:

ExactFloat::ExactFloat(double v) {
  sign_ = std::signbit(v) ? -1 : 1;
  if (std::isnan(v)) {
    set_nan();
  } else if (std::isinf(v)) {
    set_inf(sign_);
  } else {
    // The following code is much simpler than messing about with bit masks,
    // has the advantage of handling denormalized numbers and zero correctly,
    // and is actually quite efficient (at least compared to the rest of this
    // code).  "f" is a fraction in the range [0.5, 1), so if we shift it left
    // by the number of mantissa bits in a double (53, including the leading
    // "1") then the result is always an integer.
    int exp;
    double f = frexp(fabs(v), &exp);
    uint64 m = static_cast<uint64>(ldexp(f, kDoubleMantissaBits));
    BN_ext_set_uint64(bn_.get(), m);
    bn_exp_ = exp - kDoubleMantissaBits;
    Canonicalize();
  }
}